

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  string *filename;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  *pvVar1;
  bool bVar2;
  __type _Var3;
  FileFormat FVar4;
  cmMakefile *this_00;
  Keywords *pKVar5;
  reference ppcVar6;
  size_type sVar7;
  string *this_01;
  cmake *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_04;
  reference ppVar8;
  type pMVar9;
  const_iterator pvVar10;
  reference muf_00;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *this_05;
  reference ppcVar11;
  ulong uVar12;
  pointer pMVar13;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *pvVar14;
  reference ppMVar15;
  char *pcVar16;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *pvVar17;
  mapped_type *this_06;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  reference pQVar18;
  element_type *peVar19;
  PolicyID id;
  undefined1 rcc;
  undefined8 in_R8;
  pair<std::__detail::_Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>,_bool>
  pVar20;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  bool local_b03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8;
  string local_9c0;
  undefined1 local_9a0 [8];
  RccLister lister;
  string error;
  Qrc *qrc_4;
  iterator __end2_6;
  iterator __begin2_6;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nameOpts;
  undefined1 local_8f8 [8];
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  Qrc *qrc_3;
  iterator __end2_5;
  iterator __begin2_5;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_5;
  string local_880;
  reference local_860;
  string *cfg;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_1;
  string base;
  string rccFile;
  Qrc *qrc_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_4;
  cmFilePathChecksum fpathCheckSum;
  Qrc *qrc2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range3_1;
  Qrc *qrc_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range2_3;
  string local_678;
  undefined1 local_658 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionsTarget;
  undefined1 local_638 [7];
  bool modernQt;
  string local_618;
  MUFile *local_5f8;
  MUFile *muf_4;
  iterator __end4_1;
  iterator __begin4_1;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *__range4_1;
  string property;
  undefined1 local_598 [8];
  string msg;
  MUFile *muf_3;
  iterator __end3;
  iterator __begin3;
  vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  *__range3;
  undefined1 local_538 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optsVec;
  undefined1 local_518 [8];
  string uicOpts;
  undefined1 local_4f0 [6];
  bool skipUic;
  bool skipAutogen;
  string realPath;
  MUFileHandle muf_2;
  _Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
  local_4b0;
  _Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
  local_4a8;
  undefined1 local_4a0;
  MUFileHandle muf_1;
  _Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
  local_488;
  FileFormat local_47c;
  string *psStack_478;
  FileFormat fileFormat;
  string *ext_2;
  string *fullPath_2;
  string pathError_1;
  cmSourceFile *sf_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2_2;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  *__range2_1;
  MUFileHandle eMuf;
  _Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
  local_3f8;
  cmSourceFile *local_3f0;
  cmSourceFile *sf_1;
  undefined1 local_3e0 [4];
  cmSourceFileLocationKind locationKind;
  string fullPath_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string suffixedPath;
  value_type *suffix;
  const_iterator __end4;
  const_iterator __begin4;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *__range4;
  undefined1 local_340 [8];
  string basePath;
  string *srcPath;
  MUFile *muf;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exts;
  string *local_2e0;
  undefined1 local_2d8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  suffixes;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  undefined1 local_278 [8];
  string opts;
  string local_238;
  undefined1 local_218 [8];
  Qrc qrc;
  anon_class_16_2_e88080e7 local_c8;
  string *ext;
  string *local_b0;
  string *fullPath;
  string pathError;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  undefined1 local_58 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  anon_class_8_1_8991fb9c addMUFile;
  anon_class_16_2_e88080e7 makeMUFile;
  Keywords *kw;
  cmMakefile *makefile;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  pKVar5 = cmQtAutoGenGlobalInitializer::kw(this->GlobalInitializer);
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  addMUFile.this = this;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (this->Target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  sf = (cmSourceFile *)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                     *)&sf), bVar2) {
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&__end1);
    pathError.field_2._8_8_ = *ppcVar6;
    std::__cxx11::string::string((string *)&fullPath);
    local_b0 = cmSourceFile::GetFullPath
                         ((cmSourceFile *)pathError.field_2._8_8_,(string *)&fullPath);
    uVar12 = std::__cxx11::string::empty();
    if (((uVar12 & 1) == 0) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
      ext._4_4_ = 3;
    }
    else {
      local_c8.kw = (Keywords *)
                    cmSourceFile::GetExtension_abi_cxx11_((cmSourceFile *)pathError.field_2._8_8_);
      bVar2 = MocOrUicEnabled(this);
      if (bVar2) {
        FVar4 = cmSystemTools::GetFileFormat(&(local_c8.kw)->AUTOMOC);
        if (FVar4 == CXX_FILE_FORMAT) {
          in_R8 = 1;
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)
                     &qrc.Resources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmSourceFile *)&addMUFile,
                     (string *)pathError.field_2._8_8_,SUB81(local_b0,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     &srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (MUFileHandle *)
                     &qrc.Resources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          std::
          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                         *)&qrc.Resources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (FVar4 == HEADER_FILE_FORMAT) {
          in_R8 = 1;
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    (&local_c8,(cmSourceFile *)&addMUFile,(string *)pathError.field_2._8_8_,
                     SUB81(local_b0,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     &srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(MUFileHandle *)&local_c8,
                     true);
          std::
          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                         *)&local_c8);
        }
      }
      if ((((((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) &&
           (_Var3 = std::operator==(&(local_c8.kw)->AUTOMOC,&pKVar5->qrc), _Var3)) &&
          (bVar2 = cmSourceFile::GetPropertyAsBool
                             ((cmSourceFile *)pathError.field_2._8_8_,&pKVar5->SKIP_AUTOGEN), !bVar2
          )) && (bVar2 = cmSourceFile::GetPropertyAsBool
                                   ((cmSourceFile *)pathError.field_2._8_8_,&pKVar5->SKIP_AUTORCC),
                !bVar2)) {
        Qrc::Qrc((Qrc *)local_218);
        cmsys::SystemTools::GetRealPath(&local_238,local_b0,(string *)0x0);
        filename = (string *)(qrc.LockFile.field_2._M_local_buf + 8);
        std::__cxx11::string::operator=((string *)filename,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)((long)&opts.field_2 + 8),filename);
        std::__cxx11::string::operator=
                  ((string *)(qrc.QrcFile.field_2._M_local_buf + 8),
                   (string *)(opts.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(opts.field_2._M_local_buf + 8));
        qrc.RccFile.field_2._M_local_buf[8] =
             cmSourceFile::GetIsGenerated((cmSourceFile *)pathError.field_2._8_8_);
        pcVar16 = cmSourceFile::GetSafeProperty
                            ((cmSourceFile *)pathError.field_2._8_8_,&pKVar5->AUTORCC_OPTIONS);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,pcVar16,
                   (allocator<char> *)
                   ((long)&extraHeaders.
                           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&extraHeaders.
                           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          cmSystemTools::ExpandListArgument
                    ((string *)local_278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&qrc.Generated,false);
        }
        std::__cxx11::string::~string((string *)local_278);
        std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
        push_back(&(this->Rcc).Qrcs,(value_type *)local_218);
        Qrc::~Qrc((Qrc *)local_218);
      }
      ext._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&fullPath);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  bVar2 = MocOrUicEnabled(this);
  if (bVar2) {
    pvVar1 = (vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
              *)((long)&suffixes._M_elems[1].field_2 + 8);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::vector(pvVar1);
    sVar7 = std::
            unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
            ::size(&(this->AutogenTarget).Sources);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve(pvVar1,sVar7 * 2);
    exts._5_1_ = 1;
    local_2e0 = (string *)local_2d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d8,"",(allocator<char> *)((long)&exts + 7));
    this_01 = (string *)(suffixes._M_elems[0].field_2._M_local_buf + 8);
    local_2e0 = this_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,"_p",(allocator<char> *)((long)&exts + 6));
    exts._5_1_ = 0;
    std::allocator<char>::~allocator((allocator<char> *)((long)&exts + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&exts + 7));
    this_02 = cmMakefile::GetCMakeInstance(this_00);
    this_03 = cmake::GetHeaderExtensions_abi_cxx11_(this_02);
    this_04 = &(this->AutogenTarget).Sources;
    __end2 = std::
             unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
             ::begin(this_04);
    pair = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
            *)std::
              unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
              ::end(this_04);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                *)&pair), bVar2) {
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
               ::operator*(&__end2);
      pMVar9 = std::
               unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
               ::operator*(&ppVar8->second);
      if (((pMVar9->MocIt & 1U) != 0) || ((pMVar9->UicIt & 1U) != 0)) {
        basePath.field_2._8_8_ = cmSourceFile::GetFullPath(pMVar9->SF,(string *)0x0);
        cmQtAutoGen::SubDirPrefix((string *)local_340,(string *)basePath.field_2._8_8_);
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)&__range4,(string *)basePath.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_340,(string *)&__range4);
        std::__cxx11::string::~string((string *)&__range4);
        __end4 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                          *)local_2d8);
        pvVar10 = std::
                  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                         *)local_2d8);
        for (; __end4 != pvVar10; __end4 = __end4 + 1) {
          suffixedPath.field_2._8_8_ = __end4;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340,__end4);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_03);
          ext_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_03);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&ext_1), bVar2) {
            fullPath_1.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end5);
            std::__cxx11::string::string((string *)local_3e0,(string *)&__range5);
            std::__cxx11::string::operator+=((string *)local_3e0,'.');
            std::__cxx11::string::operator+=((string *)local_3e0,(string *)fullPath_1.field_2._8_8_)
            ;
            sf_1._4_4_ = 1;
            local_3f0 = cmMakefile::GetSource(this_00,(string *)local_3e0,Known);
            if (local_3f0 == (cmSourceFile *)0x0) {
              bVar2 = cmsys::SystemTools::FileExists((string *)local_3e0);
              if (bVar2) {
                local_3f0 = cmMakefile::CreateSource(this_00,(string *)local_3e0,false,Known);
              }
LAB_004e715f:
              if (local_3f0 != (cmSourceFile *)0x0) {
                in_R8 = 1;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)&__range2_1,(cmSourceFile *)&addMUFile,
                           (string *)local_3f0,SUB81(local_3e0,0));
                if ((pMVar9->MocIt & 1U) == 0) {
                  pMVar13 = std::
                            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                            ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                          *)&__range2_1);
                  pMVar13->MocIt = false;
                }
                if ((pMVar9->UicIt & 1U) == 0) {
                  pMVar13 = std::
                            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                            ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                          *)&__range2_1);
                  pMVar13->UicIt = false;
                }
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                            *)(suffixes._M_elems[1].field_2._M_local_buf + 8),
                           (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                            *)&__range2_1);
                std::
                unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                               *)&__range2_1);
              }
              ext._4_4_ = 0;
            }
            else {
              local_3f8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                   ::find(&(this->AutogenTarget).Headers,&local_3f0);
              eMuf._M_t.
              super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                    )std::
                     unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                     ::end(&(this->AutogenTarget).Headers);
              bVar2 = std::__detail::operator!=
                                (&local_3f8,
                                 (_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                  *)&eMuf);
              if (bVar2) {
                ext._4_4_ = 10;
              }
              else {
                bVar2 = cmSourceFile::GetIsGenerated(local_3f0);
                if ((bVar2) || (bVar2 = cmsys::SystemTools::FileExists((string *)local_3e0), bVar2))
                goto LAB_004e715f;
                ext._4_4_ = 10;
              }
            }
            std::__cxx11::string::~string((string *)local_3e0);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::__cxx11::string::~string((string *)&__range5);
        }
        std::__cxx11::string::~string((string *)local_340);
      }
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end2);
    }
    pvVar1 = (vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
              *)((long)&suffixes._M_elems[1].field_2 + 8);
    __end2_1 = std::
               vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               ::begin(pvVar1);
    eMuf_1 = (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
              *)std::
                vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                ::end(pvVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                               *)&eMuf_1), bVar2) {
      muf_00 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
               ::operator*(&__end2_1);
      InitScanFiles::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)
                 &srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,muf_00,true);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_*,_std::vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_2d8);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)((long)&suffixes._M_elems[1].field_2 + 8));
  }
  bVar2 = MocOrUicEnabled(this);
  if (bVar2) {
    this_05 = cmMakefile::GetSourceFiles(this_00);
    __end2_2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(this_05);
    sf_2 = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(this_05);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                               *)&sf_2), bVar2) {
      ppcVar11 = __gnu_cxx::
                 __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                 ::operator*(&__end2_2);
      pathError_1.field_2._8_8_ = *ppcVar11;
      std::__cxx11::string::string((string *)&fullPath_2);
      ext_2 = cmSourceFile::GetFullPath
                        ((cmSourceFile *)pathError_1.field_2._8_8_,(string *)&fullPath_2);
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
        ext._4_4_ = 0xe;
      }
      else {
        psStack_478 = cmSourceFile::GetExtension_abi_cxx11_
                                ((cmSourceFile *)pathError_1.field_2._8_8_);
        local_47c = cmSystemTools::GetFileFormat(psStack_478);
        if (local_47c == HEADER_FILE_FORMAT) {
          local_488._M_cur =
               (__node_type *)
               std::
               unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
               ::find(&(this->AutogenTarget).Headers,(key_type *)((long)&pathError_1.field_2 + 8));
          muf_1._M_t.
          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                )std::
                 unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                 ::end(&(this->AutogenTarget).Headers);
          bVar2 = std::__detail::operator==
                            (&local_488,
                             (_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              *)&muf_1);
          if (bVar2) {
            in_R8 = 0;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&stack0xfffffffffffffb68,
                       (cmSourceFile *)&addMUFile,(string *)pathError_1.field_2._8_8_,SUB81(ext_2,0)
                      );
            pMVar13 = std::
                      unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                    *)&stack0xfffffffffffffb68);
            if (((pMVar13->SkipMoc & 1U) != 0) ||
               (pMVar13 = std::
                          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                        *)&stack0xfffffffffffffb68), (pMVar13->SkipUic & 1U) != 0))
            {
              pVar20 = std::
                       unordered_map<cmSourceFile*,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::hash<cmSourceFile*>,std::equal_to<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>>
                       ::
                       emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                 ((unordered_map<cmSourceFile*,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::hash<cmSourceFile*>,std::equal_to<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>>
                                   *)&(this->AutogenTarget).Headers,
                                  (cmSourceFile **)((long)&pathError_1.field_2 + 8),
                                  (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                   *)&stack0xfffffffffffffb68);
              local_4a8._M_cur =
                   (__node_type *)
                   pVar20.first.
                   super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                   ._M_cur;
              local_4a0 = pVar20.second;
            }
            std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           *)&stack0xfffffffffffffb68);
          }
        }
        else if (local_47c == CXX_FILE_FORMAT) {
          local_4b0._M_cur =
               (__node_type *)
               std::
               unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
               ::find(&(this->AutogenTarget).Sources,(key_type *)((long)&pathError_1.field_2 + 8));
          muf_2._M_t.
          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>,_true,_true>
                )std::
                 unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                 ::end(&(this->AutogenTarget).Sources);
          bVar2 = std::__detail::operator==
                            (&local_4b0,
                             (_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              *)&muf_2);
          if (bVar2) {
            in_R8 = 0;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&stack0xfffffffffffffb40,
                       (cmSourceFile *)&addMUFile,(string *)pathError_1.field_2._8_8_,SUB81(ext_2,0)
                      );
            pMVar13 = std::
                      unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                      ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                    *)&stack0xfffffffffffffb40);
            if (((pMVar13->SkipMoc & 1U) != 0) ||
               (pMVar13 = std::
                          unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ::operator->((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                        *)&stack0xfffffffffffffb40), (pMVar13->SkipUic & 1U) != 0))
            {
              pVar20 = std::
                       unordered_map<cmSourceFile*,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::hash<cmSourceFile*>,std::equal_to<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>>
                       ::
                       emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                 ((unordered_map<cmSourceFile*,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::hash<cmSourceFile*>,std::equal_to<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>>
                                   *)&(this->AutogenTarget).Sources,
                                  (cmSourceFile **)((long)&pathError_1.field_2 + 8),
                                  (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                                   *)&stack0xfffffffffffffb40);
              realPath.field_2._8_8_ =
                   pVar20.first.
                   super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                   ._M_cur;
            }
            std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           *)&stack0xfffffffffffffb40);
          }
        }
        else if ((((this->Uic).super_GenVarsT.Enabled & 1U) != 0) &&
                (_Var3 = std::operator==(psStack_478,&pKVar5->ui), _Var3)) {
          cmsys::SystemTools::GetRealPath((string *)local_4f0,ext_2,(string *)0x0);
          uicOpts.field_2._M_local_buf[0xf] =
               cmSourceFile::GetPropertyAsBool
                         ((cmSourceFile *)pathError_1.field_2._8_8_,&pKVar5->SKIP_AUTOGEN);
          local_b03 = true;
          if (!(bool)uicOpts.field_2._M_local_buf[0xf]) {
            local_b03 = cmSourceFile::GetPropertyAsBool
                                  ((cmSourceFile *)pathError_1.field_2._8_8_,&pKVar5->SKIP_AUTOUIC);
          }
          uicOpts.field_2._M_local_buf[0xe] = local_b03;
          if (local_b03 == false) {
            pcVar16 = cmSourceFile::GetSafeProperty
                                ((cmSourceFile *)pathError_1.field_2._8_8_,&pKVar5->AUTOUIC_OPTIONS)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_518,pcVar16,
                       (allocator<char> *)
                       ((long)&optsVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&optsVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&(this->Uic).FileFiles,(value_type *)local_4f0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_538);
              cmSystemTools::ExpandListArgument
                        ((string *)local_518,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_538,false);
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::push_back(&(this->Uic).FileOptions,(value_type *)local_538);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_538);
            }
            std::__cxx11::string::~string((string *)local_518);
          }
          else {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&(this->Uic).SkipUi,(value_type *)local_4f0);
          }
          std::__cxx11::string::~string((string *)local_4f0);
        }
        ext._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&fullPath_2);
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end2_2);
    }
  }
  bVar2 = MocOrUicEnabled(this);
  if ((bVar2) &&
     (bVar2 = std::
              vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ::empty(&(this->AutogenTarget).FilesGenerated), !bVar2)) {
    if ((this->CMP0071Accept & 1U) == 0) {
      if ((this->CMP0071Warn & 1U) != 0) {
        std::__cxx11::string::string((string *)local_598);
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  ((string *)((long)&property.field_2 + 8),(cmPolicies *)0x47,id);
        std::__cxx11::string::operator+=
                  ((string *)local_598,(string *)(property.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(property.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_598,'\n');
        std::__cxx11::string::string((string *)&__range4_1);
        if ((((this->Moc).super_GenVarsT.Enabled & 1U) == 0) ||
           (((this->Uic).super_GenVarsT.Enabled & 1U) == 0)) {
          if (((this->Moc).super_GenVarsT.Enabled & 1U) == 0) {
            if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
              std::__cxx11::string::operator=((string *)&__range4_1,(string *)&pKVar5->SKIP_AUTOUIC)
              ;
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&__range4_1,(string *)&pKVar5->SKIP_AUTOMOC);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&__range4_1,(string *)&pKVar5->SKIP_AUTOGEN);
        }
        std::__cxx11::string::operator+=
                  ((string *)local_598,
                   "For compatibility, CMake is excluding the GENERATED source file(s):\n");
        pvVar14 = &(this->AutogenTarget).FilesGenerated;
        __end4_1 = std::
                   vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                   ::begin(pvVar14);
        muf_4 = (MUFile *)
                std::
                vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                ::end(pvVar14);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                              *)&muf_4);
          rcc = (undefined1)in_R8;
          if (!bVar2) break;
          ppMVar15 = __gnu_cxx::
                     __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                     ::operator*(&__end4_1);
          local_5f8 = *ppMVar15;
          std::__cxx11::string::operator+=((string *)local_598,"  ");
          cmQtAutoGen::Quoted(&local_618,&local_5f8->RealPath);
          std::__cxx11::string::operator+=((string *)local_598,(string *)&local_618);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::operator+=((string *)local_598,'\n');
          __gnu_cxx::
          __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
          ::operator++(&__end4_1);
        }
        std::__cxx11::string::operator+=((string *)local_598,"from processing by ");
        cmQtAutoGen::Tools_abi_cxx11_
                  ((string *)local_638,
                   (cmQtAutoGen *)(ulong)((this->Moc).super_GenVarsT.Enabled & 1),
                   (bool)((this->Uic).super_GenVarsT.Enabled & 1),false,(bool)rcc);
        std::__cxx11::string::operator+=((string *)local_598,(string *)local_638);
        std::__cxx11::string::~string((string *)local_638);
        std::__cxx11::string::operator+=
                  ((string *)local_598,
                   ". If any of the files should be processed, set CMP0071 to NEW. If any of the files should not be processed, explicitly exclude them by setting the source file property "
                  );
        std::__cxx11::string::operator+=((string *)local_598,(string *)&__range4_1);
        std::__cxx11::string::operator+=
                  ((string *)local_598,":\n  set_property(SOURCE file.h PROPERTY ");
        std::__cxx11::string::operator+=((string *)local_598,(string *)&__range4_1);
        std::__cxx11::string::operator+=((string *)local_598," ON)\n");
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_598);
        std::__cxx11::string::~string((string *)&__range4_1);
        std::__cxx11::string::~string((string *)local_598);
      }
    }
    else {
      pvVar14 = &(this->AutogenTarget).FilesGenerated;
      __end3 = std::
               vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ::begin(pvVar14);
      muf_3 = (MUFile *)
              std::
              vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ::end(pvVar14);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                                         *)&muf_3), bVar2) {
        ppMVar15 = __gnu_cxx::
                   __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
                   ::operator*(&__end3);
        pVar21 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&(this->AutogenTarget).DependFiles,&(*ppMVar15)->RealPath);
        msg.field_2._8_8_ = pVar21.first._M_node;
        __gnu_cxx::
        __normal_iterator<cmQtAutoGenInitializer::MUFile_**,_std::vector<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>_>
        ::operator++(&__end3);
      }
    }
  }
  bVar2 = std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          empty(&(this->Rcc).Qrcs);
  if (!bVar2) {
    optionsTarget.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 4 < (this->QtVersion).Major;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_658);
    pcVar16 = cmGeneratorTarget::GetSafeProperty(this->Target,&pKVar5->AUTORCC_OPTIONS);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_678,pcVar16,(allocator<char> *)((long)&__range2_3 + 7));
    cmSystemTools::ExpandListArgument
              (&local_678,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_658,false);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_3 + 7));
    pvVar17 = &(this->Rcc).Qrcs;
    __end2_3 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar17);
    qrc_1 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar17);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                               *)&qrc_1), bVar2) {
      pQVar18 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_3);
      pQVar18->Unique = true;
      pvVar17 = &(this->Rcc).Qrcs;
      __end3_1 = std::
                 vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
                 begin(pvVar17);
      qrc2 = (Qrc *)std::
                    vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    ::end(pvVar17);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                                 *)&qrc2), bVar2) {
        fpathCheckSum.parentDirs._M_elems[3].second.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
             ::operator*(&__end3_1);
        if ((pQVar18 != (reference)fpathCheckSum.parentDirs._M_elems[3].second.field_2._8_8_) &&
           (_Var3 = std::operator==(&pQVar18->QrcName,
                                    &((reference)
                                     fpathCheckSum.parentDirs._M_elems[3].second.field_2._8_8_)->
                                     QrcName), _Var3)) {
          pQVar18->Unique = false;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
        ::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_3);
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)&__range2_4,this_00);
    pvVar17 = &(this->Rcc).Qrcs;
    __end2_4 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar17);
    qrc_2 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar17);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                               *)&qrc_2), bVar2) {
      pQVar18 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_4);
      cmFilePathChecksum::getPart
                ((string *)((long)&rccFile.field_2 + 8),(cmFilePathChecksum *)&__range2_4,
                 &pQVar18->QrcFile,10);
      std::__cxx11::string::operator=
                ((string *)&pQVar18->PathChecksum,(string *)(rccFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(rccFile.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&base.field_2 + 8),&(this->Dir).Build,"/");
      std::__cxx11::string::operator+=
                ((string *)(base.field_2._M_local_buf + 8),(string *)&pQVar18->PathChecksum);
      std::__cxx11::string::operator+=((string *)(base.field_2._M_local_buf + 8),"/qrc_");
      std::__cxx11::string::operator+=
                ((string *)(base.field_2._M_local_buf + 8),(string *)&pQVar18->QrcName);
      std::__cxx11::string::operator+=((string *)(base.field_2._M_local_buf + 8),".cpp");
      std::__cxx11::string::operator=
                ((string *)&pQVar18->RccFile,(string *)(base.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&__range5_1,(string *)&this->Dir);
      std::__cxx11::string::operator+=((string *)&__range5_1,"/RCC");
      std::__cxx11::string::operator+=((string *)&__range5_1,(string *)&pQVar18->QrcName);
      if ((pQVar18->Unique & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)&__range5_1,(string *)&pQVar18->PathChecksum);
      }
      std::__cxx11::string::operator=((string *)pQVar18,(string *)&__range5_1);
      std::__cxx11::string::operator+=((string *)pQVar18,".lock");
      std::__cxx11::string::operator=((string *)&pQVar18->InfoFile,(string *)&__range5_1);
      std::__cxx11::string::operator+=((string *)&pQVar18->InfoFile,"Info.cmake");
      std::__cxx11::string::operator=((string *)&pQVar18->SettingsFile,(string *)&__range5_1);
      std::__cxx11::string::operator+=((string *)&pQVar18->SettingsFile,"Settings.txt");
      if ((this->MultiConfig & 1U) != 0) {
        __end5_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->ConfigsList);
        cfg = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->ConfigsList);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&cfg), bVar2) {
          local_860 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end5_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2_5,"_",local_860);
          cmQtAutoGen::AppendFilenameSuffix(&local_880,&pQVar18->SettingsFile,(string *)&__range2_5)
          ;
          this_06 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&pQVar18->ConfigSettingsFile,local_860);
          std::__cxx11::string::operator=((string *)this_06,(string *)&local_880);
          std::__cxx11::string::~string((string *)&local_880);
          std::__cxx11::string::~string((string *)&__range2_5);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end5_1);
        }
      }
      std::__cxx11::string::~string((string *)&__range5_1);
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_4);
    }
    cmFilePathChecksum::~cmFilePathChecksum((cmFilePathChecksum *)&__range2_4);
    pvVar17 = &(this->Rcc).Qrcs;
    __end2_5 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar17);
    qrc_3 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar17);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                               *)&qrc_3), bVar2) {
      pQVar18 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&name.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_658);
      std::__cxx11::string::string((string *)local_8f8,(string *)&pQVar18->QrcName);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      nameOpts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x2d;
      nameOpts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0x5f;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (__first,__last,
                 (char *)((long)&nameOpts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                 (char *)((long)&nameOpts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      if ((pQVar18->Unique & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)local_8f8,"_");
        std::__cxx11::string::operator+=((string *)local_8f8,(string *)&pQVar18->PathChecksum);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[6]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2_6,
                 (char (*) [6])0x85153e);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2_6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&name.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2_6,
                 (bool)(optionsTarget.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2_6);
      std::__cxx11::string::~string((string *)local_8f8);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&name.field_2 + 8),&pQVar18->Options,
                 (bool)(optionsTarget.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pQVar18->Options,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&name.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&name.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_5);
    }
    pvVar17 = &(this->Rcc).Qrcs;
    __end2_6 = std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               begin(pvVar17);
    qrc_4 = (Qrc *)std::
                   vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ::end(pvVar17);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                               *)&qrc_4), bVar2) {
      pQVar18 = __gnu_cxx::
                __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                ::operator*(&__end2_6);
      if ((pQVar18->Generated & 1U) == 0) {
        std::__cxx11::string::string
                  ((string *)
                   &lister.ListOptions_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string
                  ((string *)&local_9c0,(string *)&(this->Rcc).super_GenVarsT.Executable);
        peVar19 = std::
                  __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->Rcc).super_GenVarsT.ExecutableFeatures);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_9d8,&peVar19->ListOptions);
        cmQtAutoGen::RccLister::RccLister((RccLister *)local_9a0,&local_9c0,&local_9d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_9d8);
        std::__cxx11::string::~string((string *)&local_9c0);
        bVar2 = cmQtAutoGen::RccLister::list
                          ((RccLister *)local_9a0,&pQVar18->QrcFile,&pQVar18->Resources,
                           (string *)
                           &lister.ListOptions_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        if (!bVar2) {
          cmSystemTools::Error
                    ((string *)
                     &lister.ListOptions_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          this_local._7_1_ = 0;
        }
        ext._4_4_ = (uint)!bVar2;
        cmQtAutoGen::RccLister::~RccLister((RccLister *)local_9a0);
        std::__cxx11::string::~string
                  ((string *)
                   &lister.ListOptions_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (ext._4_4_ != 0) goto LAB_004e89c0;
      }
      __gnu_cxx::
      __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
      ::operator++(&__end2_6);
    }
    ext._4_4_ = 0;
LAB_004e89c0:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_658);
    if (ext._4_4_ != 0) goto LAB_004e89ee;
  }
  this_local._7_1_ = 1;
LAB_004e89ee:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == kw.qrc) && !sf->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !sf->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcPath = muf.SF->GetFullPath();
        std::string basePath = cmQtAutoGen::SubDirPrefix(srcPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(srcPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == kw.ui)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = kw.SKIP_AUTOGEN;
      } else if (this->Moc.Enabled) {
        property = kw.SKIP_AUTOMOC;
      } else if (this->Uic.Enabled) {
        property = kw.SKIP_AUTOUIC;
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty(kw.AUTORCC_OPTIONS), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}